

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

int AF_AActor_A_SkullPop
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *other;
  VMValue *pVVar1;
  player_t *ppVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  VMValue *pVVar7;
  PClass *pPVar8;
  PClassPlayerPawn *type;
  APlayerPawn *this;
  undefined8 *puVar9;
  PClassPlayerPawn *pPVar10;
  long lVar11;
  AActor *pAVar12;
  char *pcVar13;
  bool bVar14;
  DVector3 local_40;
  
  pPVar8 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar13 = "(paramnum) < numparam";
LAB_0046dd51:
    __assert_fail(pcVar13,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                  ,0x68d,
                  "int AF_AActor_A_SkullPop(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
    pcVar13 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_0046dd51;
  }
  other = (AActor *)(param->field_0).field_1.a;
  if (other != (AActor *)0x0) {
    if ((other->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar3 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
      (other->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
    }
    pPVar6 = (other->super_DThinker).super_DObject.Class;
    bVar14 = pPVar6 != (PClass *)0x0;
    if (pPVar6 != pPVar8 && bVar14) {
      do {
        pPVar6 = pPVar6->ParentClass;
        bVar14 = pPVar6 != (PClass *)0x0;
        if (pPVar6 == pPVar8) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    if (!bVar14) {
      pcVar13 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0046dd51;
    }
  }
  if (numparam == 1) {
    pVVar1 = defaultparam->Array;
    if ((pVVar1[1].field_0.field_3.Type != '\x03') ||
       ((pVVar7 = pVVar1 + 1, pVVar1[1].field_0.field_1.atag != 1 &&
        ((pVVar7->field_0).field_1.a != (void *)0x0)))) {
      pcVar13 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_0046dd32:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                    ,0x68e,
                    "int AF_AActor_A_SkullPop(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else if ((param[1].field_0.field_3.Type != '\x03') ||
          ((pVVar7 = param + 1, param[1].field_0.field_1.atag != 1 &&
           ((pVVar7->field_0).field_1.a != (void *)0x0)))) {
    pcVar13 = 
    "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
    ;
    goto LAB_0046dd32;
  }
  type = (PClassPlayerPawn *)(pVVar7->field_0).field_1.a;
  if (type != (PClassPlayerPawn *)0x0) {
    pPVar10 = type;
    if (type == (PClassPlayerPawn *)APlayerChunk::RegistrationInfo.MyClass) goto LAB_0046db9f;
    do {
      pPVar10 = (PClassPlayerPawn *)(pPVar10->super_PClassActor).super_PClass.ParentClass;
      if (pPVar10 == (PClassPlayerPawn *)APlayerChunk::RegistrationInfo.MyClass) break;
    } while (pPVar10 != (PClassPlayerPawn *)0x0);
    if (pPVar10 != (PClassPlayerPawn *)0x0) goto LAB_0046db9f;
  }
  iVar3 = FName::NameManager::FindName(&FName::NameData,"BloodySkull",true);
  local_40.X = (double)CONCAT44(local_40.X._4_4_,iVar3);
  pPVar8 = PClass::FindClass((FName *)&local_40);
  type = dyn_cast<PClassPlayerPawn>((DObject *)pPVar8);
  if (type == (PClassPlayerPawn *)0x0) {
    return 0;
  }
LAB_0046db9f:
  *(byte *)&(other->flags).Value = (byte)(other->flags).Value & 0xfd;
  local_40.Z = (other->__Pos).Z + 48.0;
  local_40.X = (other->__Pos).X;
  local_40.Y = (other->__Pos).Y;
  this = (APlayerPawn *)AActor::StaticSpawn(&type->super_PClassActor,&local_40,NO_REPLACE,false);
  uVar4 = FRandom::GenRand32(&pr_skullpop);
  uVar5 = FRandom::GenRand32(&pr_skullpop);
  (this->super_AActor).Vel.X = (double)(int)((uVar4 & 0xff) - (uVar5 & 0xff)) * 0.0078125;
  uVar4 = FRandom::GenRand32(&pr_skullpop);
  uVar5 = FRandom::GenRand32(&pr_skullpop);
  (this->super_AActor).Vel.Y = (double)(int)((uVar4 & 0xff) - (uVar5 & 0xff)) * 0.0078125;
  uVar4 = FRandom::GenRand32(&pr_skullpop);
  (this->super_AActor).Vel.Z = (double)(uVar4 & 0xff) * 0.0009765625 + 2.0;
  ppVar2 = other->player;
  other->player = (player_t *)0x0;
  AActor::ObtainInventory((AActor *)this,other);
  (this->super_AActor).player = ppVar2;
  (this->super_AActor).health = other->health;
  (this->super_AActor).Angles.Yaw.Degrees = (other->Angles).Yaw.Degrees;
  if (ppVar2 != (player_t *)0x0) {
    ppVar2->mo = this;
    ppVar2->damagecount = 0x20;
  }
  puVar9 = &DAT_017e5fc8;
  lVar11 = 0;
  do {
    if (playeringame[lVar11] == true) {
      pAVar12 = (AActor *)*puVar9;
      if ((pAVar12 != (AActor *)0x0) &&
         (((pAVar12->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        *puVar9 = 0;
        pAVar12 = (AActor *)0x0;
      }
      if (pAVar12 == other) {
        *puVar9 = this;
      }
    }
    lVar11 = lVar11 + 1;
    puVar9 = puVar9 + 0x54;
  } while (lVar11 != 8);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SkullPop)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS_DEF(spawntype, APlayerChunk);

	APlayerPawn *mo;
	player_t *player;

	// [GRB] Parameterized version
	if (spawntype == NULL || !spawntype->IsDescendantOf(RUNTIME_CLASS(APlayerChunk)))
	{
		spawntype = dyn_cast<PClassPlayerPawn>(PClass::FindClass("BloodySkull"));
		if (spawntype == NULL)
			return 0;
	}

	self->flags &= ~MF_SOLID;
	mo = (APlayerPawn *)Spawn (spawntype, self->PosPlusZ(48.), NO_REPLACE);
	//mo->target = self;
	mo->Vel.X = pr_skullpop.Random2() / 128.;
	mo->Vel.Y = pr_skullpop.Random2() / 128.;
	mo->Vel.Z = 2. + (pr_skullpop() / 1024.);
	// Attach player mobj to bloody skull
	player = self->player;
	self->player = NULL;
	mo->ObtainInventory (self);
	mo->player = player;
	mo->health = self->health;
	mo->Angles.Yaw = self->Angles.Yaw;
	if (player != NULL)
	{
		player->mo = mo;
		player->damagecount = 32;
	}
	for (int i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i] && players[i].camera == self)
		{
			players[i].camera = mo;
		}
	}
	return 0;
}